

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void do_opt(int *ip)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char cStack_59;
  char name [32];
  
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
LAB_0010b247:
  do {
    iVar3 = *ip;
    pcVar5 = prlnbuf + iVar3;
    while (iVar3 = iVar3 + 1, (*(byte *)((long)puVar2 + (long)*pcVar5 * 2 + 1) & 0x20) != 0) {
      *ip = iVar3;
      pcVar5 = pcVar5 + 1;
    }
    *ip = iVar3;
    cVar1 = *pcVar5;
  } while (cVar1 == ',');
  if ((cVar1 == '\0') || (cVar1 == ';')) {
    if (pass != 1) {
      return;
    }
    println();
    return;
  }
  uVar6 = 0;
  while( true ) {
    do {
    } while (cVar1 == ' ');
    if (((cVar1 == '\0') || (cVar1 == ',')) || (cVar1 == ';')) break;
    if (uVar6 == 0x20) {
      pcVar5 = "Syntax error!";
      goto LAB_0010b384;
    }
    name[uVar6] = cVar1;
    uVar6 = uVar6 + 1;
    lVar7 = (long)iVar3;
    iVar3 = iVar3 + 1;
    *ip = iVar3;
    cVar1 = prlnbuf[lVar7];
  }
  name[uVar6 & 0xffffffff] = '\0';
  iVar3 = (int)uVar6 + -1;
  cVar1 = name[iVar3];
  name[iVar3] = '\0';
  iVar3 = strcasecmp(name,"l");
  if (iVar3 == 0) {
    lVar7 = 0;
  }
  else {
    iVar3 = strcasecmp(name,"m");
    lVar7 = 1;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(name,"w");
      lVar7 = 2;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(name,"o");
        lVar7 = 3;
        if (iVar3 != 0) {
          pcVar5 = "Unknown option!";
LAB_0010b384:
          error(pcVar5);
          return;
        }
      }
    }
  }
  iVar3 = 1;
  if (cVar1 != '+') goto code_r0x0010b32b;
  goto LAB_0010b337;
code_r0x0010b32b:
  if (cVar1 == '-') {
    iVar3 = 0;
LAB_0010b337:
    asm_opt[lVar7] = iVar3;
  }
  goto LAB_0010b247;
}

Assistant:

void
do_opt(int *ip)
{
	char c;
	char flag;
	char name[32];
	int  opt;
	int  i;

	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* get char */
		c = prlnbuf[(*ip)++];

		/* no option */
		if (c == ',')
			continue;

		/* end of line */
		if (c == ';' || c == '\0')
			break;

		/* extract option */
		i = 0;
		for (;;) {
			if (c == ' ')
				continue;
			if (c == ',' || c == ';' || c == '\0')
				break;
			if (i > 31) {
				error("Syntax error!");
				return;
			}
			name[i++] = c;
			c = prlnbuf[(*ip)++];
		}

		/* get option flag */
		name[i] = '\0';
		flag = name[--i];
		name[i] = '\0';

		/* search option */
		if (!strcasecmp(name, "l"))
			opt = OPT_LIST;
		else if (!strcasecmp(name, "m"))
			opt = OPT_MACRO;
		else if (!strcasecmp(name, "w"))
			opt = OPT_WARNING;
		else if (!strcasecmp(name, "o"))
			opt = OPT_OPTIMIZE;
		else {
			error("Unknown option!");
			return;
		}

		/* set option */
		if (flag == '+')
			asm_opt[opt] = 1;
		if (flag == '-')
			asm_opt[opt] = 0;
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}